

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.c
# Opt level: O0

void write_filter_intra_mode_info(AV1_COMMON *cm,MACROBLOCKD *xd,MB_MODE_INFO *mbmi,aom_writer *w)

{
  int iVar1;
  AV1_COMMON *in_RCX;
  long in_RDX;
  aom_writer *in_RSI;
  FILTER_INTRA_MODE mode;
  undefined4 in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  iVar1 = av1_filter_intra_allowed
                    (in_RCX,(MB_MODE_INFO *)
                            CONCAT44(in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8));
  if ((iVar1 != 0) &&
     (aom_write_symbol(in_RSI,(int)((ulong)in_RDX >> 0x20),(aom_cdf_prob *)in_RCX,
                       in_stack_ffffffffffffffdc), *(char *)(in_RDX + 0x5b) != '\0')) {
    aom_write_symbol(in_RSI,(int)((ulong)in_RDX >> 0x20),(aom_cdf_prob *)in_RCX,
                     CONCAT13(*(undefined1 *)(in_RDX + 0x5a),(int3)in_stack_ffffffffffffffdc));
  }
  return;
}

Assistant:

static inline void write_filter_intra_mode_info(const AV1_COMMON *cm,
                                                const MACROBLOCKD *xd,
                                                const MB_MODE_INFO *const mbmi,
                                                aom_writer *w) {
  if (av1_filter_intra_allowed(cm, mbmi)) {
    aom_write_symbol(w, mbmi->filter_intra_mode_info.use_filter_intra,
                     xd->tile_ctx->filter_intra_cdfs[mbmi->bsize], 2);
    if (mbmi->filter_intra_mode_info.use_filter_intra) {
      const FILTER_INTRA_MODE mode =
          mbmi->filter_intra_mode_info.filter_intra_mode;
      aom_write_symbol(w, mode, xd->tile_ctx->filter_intra_mode_cdf,
                       FILTER_INTRA_MODES);
    }
  }
}